

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdefl.h
# Opt level: O2

void sdefl_match_codes(sdefl_match_codes *cod,int dist,int len)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  bVar1 = ""[len];
  cod->ls = (uint)bVar1;
  iVar3 = dist + -1;
  lVar2 = 0x3f;
  if ((long)iVar3 != 0) {
    for (; (ulong)(long)iVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  iVar5 = (2 << ((byte)lVar2 & 0x1f)) >> 2;
  if (iVar3 == 0) {
    iVar5 = 0;
  }
  cod->lc = bVar1 + 0x101;
  uVar4 = 0x3f;
  if ((long)iVar5 != 0) {
    for (; (ulong)(long)iVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  uVar4 = uVar4 & 0xffffffff;
  if (iVar5 == 0) {
    uVar4 = 0;
  }
  iVar5 = (int)uVar4;
  cod->dx = iVar5;
  if (iVar5 != 0) {
    iVar3 = (uint)(sdefl_match_codes::dxmax[uVar4] < dist) + iVar5 * 2 + 2;
  }
  cod->dc = iVar3;
  return;
}

Assistant:

static void
sdefl_match_codes(struct sdefl_match_codes *cod, int dist, int len) {
  static const short dxmax[] = {0,6,12,24,48,96,192,384,768,1536,3072,6144,12288,24576};
  static const unsigned char lslot[258+1] = {
    0, 0, 0, 0, 1, 2, 3, 4, 5, 6, 7, 8, 8, 9, 9, 10, 10, 11, 11, 12, 12, 12,
    12, 13, 13, 13, 13, 14, 14, 14, 14, 15, 15, 15, 15, 16, 16, 16, 16, 16,
    16, 16, 16, 17, 17, 17, 17, 17, 17, 17, 17, 18, 18, 18, 18, 18, 18, 18,
    18, 19, 19, 19, 19, 19, 19, 19, 19, 20, 20, 20, 20, 20, 20, 20, 20, 20,
    20, 20, 20, 20, 20, 20, 20, 21, 21, 21, 21, 21, 21, 21, 21, 21, 21, 21,
    21, 21, 21, 21, 21, 22, 22, 22, 22, 22, 22, 22, 22, 22, 22, 22, 22, 22,
    22, 22, 22, 23, 23, 23, 23, 23, 23, 23, 23, 23, 23, 23, 23, 23, 23, 23,
    23, 24, 24, 24, 24, 24, 24, 24, 24, 24, 24, 24, 24, 24, 24, 24, 24, 24,
    24, 24, 24, 24, 24, 24, 24, 24, 24, 24, 24, 24, 24, 24, 24, 25, 25, 25,
    25, 25, 25, 25, 25, 25, 25, 25, 25, 25, 25, 25, 25, 25, 25, 25, 25, 25,
    25, 25, 25, 25, 25, 25, 25, 25, 25, 25, 25, 26, 26, 26, 26, 26, 26, 26,
    26, 26, 26, 26, 26, 26, 26, 26, 26, 26, 26, 26, 26, 26, 26, 26, 26, 26,
    26, 26, 26, 26, 26, 26, 26, 27, 27, 27, 27, 27, 27, 27, 27, 27, 27, 27,
    27, 27, 27, 27, 27, 27, 27, 27, 27, 27, 27, 27, 27, 27, 27, 27, 27, 27,
    27, 27, 28
  };
  cod->ls = lslot[len];
  cod->lc = 257 + cod->ls;
  cod->dx = sdefl_ilog2(sdefl_npow2(dist) >> 2);
  cod->dc = cod->dx ? ((cod->dx + 1) << 1) + (dist > dxmax[cod->dx]) : dist-1;
}